

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_alloc.c
# Opt level: O0

int main(void)

{
  int iVar1;
  time_t tVar2;
  
  plan(4);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","main");
  tVar2 = time((time_t *)0x0);
  seed = (uint)tVar2;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"random seed is %u",(ulong)seed);
  fprintf(_stdout,"\n");
  srand(seed);
  quota_init(&quota,0xffffffff);
  slab_arena_create(&arena,&quota,0,4000000,2);
  slab_cache_create(&cache,&arena);
  small_alloc_basic();
  small_alloc_large();
  test_small_alloc_info();
  small_alloc_low_alloc_factor();
  slab_cache_destroy(&cache);
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","main");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

int main()
{
#ifdef ENABLE_ASAN
	plan(3);
#else
	plan(4);
#endif
	header();

	seed = time(NULL);
	note("random seed is %u", seed);
	srand(seed);

	quota_init(&quota, UINT_MAX);
	slab_arena_create(&arena, &quota, 0, 4000000,
			  MAP_PRIVATE);
	slab_cache_create(&cache, &arena);

	small_alloc_basic();
#ifndef ENABLE_ASAN
	small_alloc_large();
	test_small_alloc_info();
	small_alloc_low_alloc_factor();
#else
	small_wrong_size_in_free();
	small_membership();
#endif

	slab_cache_destroy(&cache);

	footer();
	return check_plan();
}